

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PortConnection * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
          (BumpAllocator *this,MultiPortSymbol *args,Symbol **args_1,SourceRange *args_2)

{
  Symbol *pSVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  PortConnection *pPVar4;
  
  pPVar4 = (PortConnection *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PortConnection *)this->endPtr < pPVar4 + 1) {
    pPVar4 = (PortConnection *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pPVar4 + 1);
  }
  pSVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  pPVar4->port = &args->super_Symbol;
  pPVar4->connectedSymbol = pSVar1;
  pPVar4->expr = (Expression *)0x0;
  pPVar4->modport = (ModportSymbol *)0x0;
  (pPVar4->field_4).implicitNameRange.startLoc = SVar2;
  (pPVar4->field_4).implicitNameRange.endLoc = SVar3;
  pPVar4->useDefault = false;
  pPVar4->isImplicit = true;
  return pPVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }